

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimClassRemoveOne(Cec_ManSim_t *p,int i)

{
  Gia_Rpr_t GVar1;
  int iVar2;
  uint Id;
  Gia_Man_t *p_00;
  
  p_00 = p->pAig;
  GVar1 = p_00->pReprs[i];
  Id = (uint)GVar1 & 0xfffffff;
  if (Id == 0) {
    p_00->pReprs[i] = (Gia_Rpr_t)((uint)GVar1 | 0xfffffff);
  }
  else {
    iVar2 = Gia_ObjIsClass(p_00,i);
    if (iVar2 == 0) {
      return 0;
    }
    if (Id == 0xfffffff) {
      Id = i;
    }
    p->vClassOld->nSize = 0;
    p->vClassNew->nSize = 0;
    iVar2 = Gia_ObjIsHead(p_00,Id);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsHead(p->pAig, iRepr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x145,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
    }
    for (; Id != 0; Id = p_00->pNexts[(int)Id]) {
      Vec_IntPush((&p->vClassOld)[Id == i],Id);
      p_00 = p->pAig;
    }
    if (p->vClassNew->nSize != 1) {
      __assert_fail("Vec_IntSize( p->vClassNew ) == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x14c,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
    }
    Cec_ManSimClassCreate(p_00,p->vClassOld);
    Cec_ManSimClassCreate(p->pAig,p->vClassNew);
    iVar2 = Gia_ObjIsClass(p->pAig,i);
    if (iVar2 != 0) {
      __assert_fail("!Gia_ObjIsClass(p->pAig, i)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecClass.c"
                    ,0x14f,"int Cec_ManSimClassRemoveOne(Cec_ManSim_t *, int)");
    }
  }
  return 1;
}

Assistant:

int Cec_ManSimClassRemoveOne( Cec_ManSim_t * p, int i )
{
    int iRepr, Ent;
    if ( Gia_ObjIsConst(p->pAig, i) )
    {
        Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
        return 1;
    }
    if ( !Gia_ObjIsClass(p->pAig, i) )
        return 0;
    assert( Gia_ObjIsClass(p->pAig, i) );
    iRepr = Gia_ObjRepr( p->pAig, i );
    if ( iRepr == GIA_VOID )
        iRepr = i;
    // collect nodes
    Vec_IntClear( p->vClassOld );
    Vec_IntClear( p->vClassNew );
    Gia_ClassForEachObj( p->pAig, iRepr, Ent )
    {
        if ( Ent == i )
            Vec_IntPush( p->vClassNew, Ent );
        else
            Vec_IntPush( p->vClassOld, Ent );
    }
    assert( Vec_IntSize( p->vClassNew ) == 1 );
    Cec_ManSimClassCreate( p->pAig, p->vClassOld );
    Cec_ManSimClassCreate( p->pAig, p->vClassNew );
    assert( !Gia_ObjIsClass(p->pAig, i) );
    return 1;
}